

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImBezierClosestPoint(ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,ImVec2 *p,int num_segments)

{
  int iVar1;
  bool bVar2;
  float fVar3;
  ImVec2 IVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  if (0 < num_segments) {
    fVar10 = 0.0;
    fVar12 = 0.0;
    fVar8 = 3.4028235e+38;
    fVar9 = (*p1).x;
    fVar11 = (*p1).y;
    iVar1 = 1;
    do {
      IVar4 = ImBezierCalc(p1,p2,p3,p4,(float)iVar1 * (1.0 / (float)num_segments));
      fVar3 = IVar4.x;
      fVar5 = IVar4.y;
      fVar13 = fVar3 - fVar9;
      fVar14 = fVar5 - fVar11;
      fVar15 = (p->x - fVar9) * fVar13 + (p->y - fVar11) * fVar14;
      fVar6 = fVar9;
      fVar7 = fVar11;
      if ((0.0 <= fVar15) &&
         (fVar16 = fVar13 * fVar13 + fVar14 * fVar14, fVar6 = fVar3, fVar7 = fVar5, fVar15 <= fVar16
         )) {
        fVar6 = (fVar13 * fVar15) / fVar16 + fVar9;
        fVar7 = (fVar14 * fVar15) / fVar16 + fVar11;
      }
      fVar9 = p->x - fVar6;
      fVar11 = p->y - fVar7;
      fVar9 = fVar9 * fVar9 + fVar11 * fVar11;
      if (fVar8 <= fVar9) {
        fVar9 = fVar8;
        fVar7 = fVar12;
        fVar6 = fVar10;
      }
      fVar10 = fVar6;
      fVar12 = fVar7;
      bVar2 = iVar1 != num_segments;
      fVar8 = fVar9;
      fVar9 = fVar3;
      fVar11 = fVar5;
      iVar1 = iVar1 + 1;
    } while (bVar2);
    IVar4.y = fVar12;
    IVar4.x = fVar10;
    return IVar4;
  }
  __assert_fail("num_segments > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/imgui/imgui.cpp"
                ,0x45f,
                "ImVec2 ImBezierClosestPoint(const ImVec2 &, const ImVec2 &, const ImVec2 &, const ImVec2 &, const ImVec2 &, int)"
               );
}

Assistant:

ImVec2 ImBezierClosestPoint(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, const ImVec2& p, int num_segments)
{
    IM_ASSERT(num_segments > 0); // Use ImBezierClosestPointCasteljau()
    ImVec2 p_last = p1;
    ImVec2 p_closest;
    float p_closest_dist2 = FLT_MAX;
    float t_step = 1.0f / (float)num_segments;
    for (int i_step = 1; i_step <= num_segments; i_step++)
    {
        ImVec2 p_current = ImBezierCalc(p1, p2, p3, p4, t_step * i_step);
        ImVec2 p_line = ImLineClosestPoint(p_last, p_current, p);
        float dist2 = ImLengthSqr(p - p_line);
        if (dist2 < p_closest_dist2)
        {
            p_closest = p_line;
            p_closest_dist2 = dist2;
        }
        p_last = p_current;
    }
    return p_closest;
}